

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomLayout::write(DomLayout *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  DomProperty **ppDVar2;
  DomProperty *pDVar3;
  DomLayoutItem **ppDVar4;
  DomLayoutItem *this_00;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  long lVar6;
  long in_FS_OFFSET;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar5._4_4_ = in_register_00000034;
  aVar5._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_50.ptr = L"layout";
    local_50.size = 6;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar7.m_size = (size_t)local_50.ptr;
  QVar7.field_0.m_data = aVar5.m_data;
  QXmlStreamWriter::writeStartElement(QVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (this->m_has_attr_class == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"class",5);
    QVar15.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_class).d.d;
    __n = (size_t)(this->m_attr_class).d.ptr;
    local_80.size = (this->m_attr_class).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar8.m_size = (size_t)local_50.ptr;
    QVar8.field_0.m_data = aVar5.m_data;
    QVar15.m_size = __n;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar8,QVar15);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_name == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"name",4);
    QVar16.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_name).d.d;
    __n = (size_t)(this->m_attr_name).d.ptr;
    local_80.size = (this->m_attr_name).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar9.m_size = (size_t)local_50.ptr;
    QVar9.field_0.m_data = aVar5.m_data;
    QVar16.m_size = __n;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar9,QVar16);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_stretch == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"stretch",7);
    QVar17.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_stretch).d.d;
    __n = (size_t)(this->m_attr_stretch).d.ptr;
    local_80.size = (this->m_attr_stretch).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar10.m_size = (size_t)local_50.ptr;
    QVar10.field_0.m_data = aVar5.m_data;
    QVar17.m_size = __n;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar10,QVar17);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_rowStretch == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"rowstretch",10);
    QVar18.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_rowStretch).d.d;
    __n = (size_t)(this->m_attr_rowStretch).d.ptr;
    local_80.size = (this->m_attr_rowStretch).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar11.m_size = (size_t)local_50.ptr;
    QVar11.field_0.m_data = aVar5.m_data;
    QVar18.m_size = __n;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar11,QVar18);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_columnStretch == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"columnstretch",0xd);
    QVar19.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_columnStretch).d.d;
    __n = (size_t)(this->m_attr_columnStretch).d.ptr;
    local_80.size = (this->m_attr_columnStretch).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar12.m_size = (size_t)local_50.ptr;
    QVar12.field_0.m_data = aVar5.m_data;
    QVar19.m_size = __n;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar12,QVar19);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_rowMinimumHeight == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"rowminimumheight",0x10);
    QVar20.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_rowMinimumHeight).d.d;
    __n = (size_t)(this->m_attr_rowMinimumHeight).d.ptr;
    local_80.size = (this->m_attr_rowMinimumHeight).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar13.m_size = (size_t)local_50.ptr;
    QVar13.field_0.m_data = aVar5.m_data;
    QVar20.m_size = __n;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar13,QVar20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_columnMinimumWidth == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"columnminimumwidth",0x12);
    QVar21.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_columnMinimumWidth).d.d;
    __n = (size_t)(this->m_attr_columnMinimumWidth).d.ptr;
    local_80.size = (this->m_attr_columnMinimumWidth).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar14.m_size = (size_t)local_50.ptr;
    QVar14.field_0.m_data = aVar5.m_data;
    QVar21.m_size = __n;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar14,QVar21);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar2 = (this->m_property).d.ptr;
  lVar1 = (this->m_property).d.size;
  for (lVar6 = 0; lVar1 << 3 != lVar6; lVar6 = lVar6 + 8) {
    pDVar3 = *(DomProperty **)((long)ppDVar2 + lVar6);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"property",8);
    DomProperty::write(pDVar3,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar2 = (this->m_attribute).d.ptr;
  lVar1 = (this->m_attribute).d.size;
  for (lVar6 = 0; lVar1 << 3 != lVar6; lVar6 = lVar6 + 8) {
    pDVar3 = *(DomProperty **)((long)ppDVar2 + lVar6);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"attribute",9);
    DomProperty::write(pDVar3,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar4 = (this->m_item).d.ptr;
  lVar1 = (this->m_item).d.size;
  for (lVar6 = 0; lVar1 << 3 != lVar6; lVar6 = lVar6 + 8) {
    this_00 = *(DomLayoutItem **)((long)ppDVar4 + lVar6);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"item",4);
    DomLayoutItem::write(this_00,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomLayout::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("layout") : tagName.toLower());

    if (hasAttributeClass())
        writer.writeAttribute(u"class"_s, attributeClass());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    if (hasAttributeStretch())
        writer.writeAttribute(u"stretch"_s, attributeStretch());

    if (hasAttributeRowStretch())
        writer.writeAttribute(u"rowstretch"_s, attributeRowStretch());

    if (hasAttributeColumnStretch())
        writer.writeAttribute(u"columnstretch"_s, attributeColumnStretch());

    if (hasAttributeRowMinimumHeight())
        writer.writeAttribute(u"rowminimumheight"_s, attributeRowMinimumHeight());

    if (hasAttributeColumnMinimumWidth())
        writer.writeAttribute(u"columnminimumwidth"_s, attributeColumnMinimumWidth());

    for (DomProperty *v : m_property)
        v->write(writer, u"property"_s);

    for (DomProperty *v : m_attribute)
        v->write(writer, u"attribute"_s);

    for (DomLayoutItem *v : m_item)
        v->write(writer, u"item"_s);

    writer.writeEndElement();
}